

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

uint Validator::constraintS2(Solution *solution)

{
  Turn *this;
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *this_00;
  Scenario *pSVar6;
  Nurse *pNVar7;
  string *psVar8;
  History *pHVar9;
  vector<Turn_*,_std::allocator<Turn_*>_> *pvVar10;
  reference ppTVar11;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
  *pmVar12;
  ShiftType *pSVar13;
  mapped_type *pmVar14;
  size_type sVar15;
  Turn *turn;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Turn_*,_std::allocator<Turn_*>_> *__range2;
  int turnN;
  undefined1 local_d0 [3];
  bool done;
  int day;
  string lastShift;
  int local_a8;
  int numberOfConsecutiveWorkingDays;
  int numberOfConsecutiveAssignments;
  string local_98;
  undefined1 local_78 [8];
  Contract contract;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
  *nurse;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *__range1;
  uint sum;
  Solution *solution_local;
  
  __range1._4_4_ = 0;
  this_00 = Solution::getNurses_abi_cxx11_(solution);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
           ::begin(this_00);
  nurse = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
             ::end(this_00);
  while (bVar3 = std::operator!=(&__end1,(_Self *)&nurse), bVar3) {
    contract._56_8_ =
         std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
         ::operator*(&__end1);
    pSVar6 = Scenario::getInstance();
    pNVar7 = NurseSolution::getNurse(*(NurseSolution **)(contract._56_8_ + 0x20));
    psVar8 = Nurse::getContract_abi_cxx11_(pNVar7);
    std::__cxx11::string::string((string *)&local_98,(string *)psVar8);
    Scenario::getContract((Contract *)local_78,pSVar6,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    pNVar7 = NurseSolution::getNurse(*(NurseSolution **)(contract._56_8_ + 0x20));
    pHVar9 = Nurse::getHistory(pNVar7);
    local_a8 = History::getNumberOfConsecutiveAssignments(pHVar9);
    pNVar7 = NurseSolution::getNurse(*(NurseSolution **)(contract._56_8_ + 0x20));
    pHVar9 = Nurse::getHistory(pNVar7);
    lastShift.field_2._12_4_ = History::getNumberOfConsecutiveWorkingDays(pHVar9);
    pNVar7 = NurseSolution::getNurse(*(NurseSolution **)(contract._56_8_ + 0x20));
    pHVar9 = Nurse::getHistory(pNVar7);
    psVar8 = History::getLastAssignedShiftType_abi_cxx11_(pHVar9);
    std::__cxx11::string::string((string *)local_d0,(string *)psVar8);
    turnN = -1;
    __range2._4_4_ = 0;
    pvVar10 = NurseSolution::getTurns(*(NurseSolution **)(contract._56_8_ + 0x20));
    __end2 = std::vector<Turn_*,_std::allocator<Turn_*>_>::begin(pvVar10);
    turn = (Turn *)std::vector<Turn_*,_std::allocator<Turn_*>_>::end(pvVar10);
    while( true ) {
      bVar3 = false;
      bVar4 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                                  *)&turn);
      if (!bVar4) break;
      ppTVar11 = __gnu_cxx::
                 __normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
                 operator*(&__end2);
      this = *ppTVar11;
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d0,"None");
      if (bVar4) {
        lastShift.field_2._12_4_ = 1;
      }
      else {
        iVar5 = Turn::getDay(this);
        uVar1 = lastShift.field_2._12_4_;
        if (iVar5 == turnN + 1) {
          lastShift.field_2._12_4_ = lastShift.field_2._12_4_ + 1;
        }
        else {
          iVar5 = Contract::getMinimumNumberOfConsecutiveWorkingDays((Contract *)local_78);
          uVar2 = lastShift.field_2._12_4_;
          if ((int)uVar1 < iVar5) {
            iVar5 = Contract::getMinimumNumberOfConsecutiveWorkingDays((Contract *)local_78);
            __range1._4_4_ = (iVar5 - lastShift.field_2._12_4_) * 0x1e + __range1._4_4_;
          }
          else {
            iVar5 = Contract::getMaximumNumberOfConsecutiveWorkingDays((Contract *)local_78);
            uVar1 = lastShift.field_2._12_4_;
            if (iVar5 < (int)uVar2) {
              iVar5 = Contract::getMinimumNumberOfConsecutiveWorkingDays((Contract *)local_78);
              __range1._4_4_ = (uVar1 - iVar5) * 0x1e + __range1._4_4_;
            }
          }
          pSVar6 = Scenario::getInstance();
          pmVar12 = Scenario::getShifts_abi_cxx11_(pSVar6);
          pSVar13 = Turn::getShiftType(this);
          psVar8 = ShiftType::getId_abi_cxx11_(pSVar13);
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                    ::at(pmVar12,psVar8);
          iVar5 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar14);
          uVar1 = lastShift.field_2._12_4_;
          if (local_a8 < iVar5) {
            pSVar6 = Scenario::getInstance();
            pmVar12 = Scenario::getShifts_abi_cxx11_(pSVar6);
            pSVar13 = Turn::getShiftType(this);
            psVar8 = ShiftType::getId_abi_cxx11_(pSVar13);
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                      ::at(pmVar12,psVar8);
            iVar5 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar14);
            __range1._4_4_ = (iVar5 - local_a8) * 0xf + __range1._4_4_;
          }
          else {
            pSVar6 = Scenario::getInstance();
            pmVar12 = Scenario::getShifts_abi_cxx11_(pSVar6);
            pSVar13 = Turn::getShiftType(this);
            psVar8 = ShiftType::getId_abi_cxx11_(pSVar13);
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                      ::at(pmVar12,psVar8);
            iVar5 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar14);
            if (iVar5 < (int)uVar1) {
              pSVar6 = Scenario::getInstance();
              pmVar12 = Scenario::getShifts_abi_cxx11_(pSVar6);
              pSVar13 = Turn::getShiftType(this);
              psVar8 = ShiftType::getId_abi_cxx11_(pSVar13);
              pmVar14 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                        ::at(pmVar12,psVar8);
              iVar5 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar14);
              __range1._4_4_ = (local_a8 - iVar5) * 0xf + __range1._4_4_;
            }
          }
          lastShift.field_2._12_4_ = 1;
          local_a8 = 1;
          bVar3 = true;
        }
      }
      if (!bVar3) {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d0,"None");
        if (bVar3) {
          local_a8 = 1;
        }
        else {
          pSVar13 = Turn::getShiftType(this);
          psVar8 = ShiftType::getId_abi_cxx11_(pSVar13);
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0,psVar8);
          if (bVar3) {
            pSVar6 = Scenario::getInstance();
            pmVar12 = Scenario::getShifts_abi_cxx11_(pSVar6);
            pSVar13 = Turn::getShiftType(this);
            psVar8 = ShiftType::getId_abi_cxx11_(pSVar13);
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                      ::at(pmVar12,psVar8);
            iVar5 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar14);
            uVar1 = lastShift.field_2._12_4_;
            if (local_a8 < iVar5) {
              pSVar6 = Scenario::getInstance();
              pmVar12 = Scenario::getShifts_abi_cxx11_(pSVar6);
              pSVar13 = Turn::getShiftType(this);
              psVar8 = ShiftType::getId_abi_cxx11_(pSVar13);
              pmVar14 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                        ::at(pmVar12,psVar8);
              iVar5 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar14);
              __range1._4_4_ = (iVar5 - local_a8) * 0xf + __range1._4_4_;
            }
            else {
              pSVar6 = Scenario::getInstance();
              pmVar12 = Scenario::getShifts_abi_cxx11_(pSVar6);
              pSVar13 = Turn::getShiftType(this);
              psVar8 = ShiftType::getId_abi_cxx11_(pSVar13);
              pmVar14 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                        ::at(pmVar12,psVar8);
              iVar5 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar14);
              if (iVar5 < (int)uVar1) {
                pSVar6 = Scenario::getInstance();
                pmVar12 = Scenario::getShifts_abi_cxx11_(pSVar6);
                pSVar13 = Turn::getShiftType(this);
                psVar8 = ShiftType::getId_abi_cxx11_(pSVar13);
                pmVar14 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                          ::at(pmVar12,psVar8);
                iVar5 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar14);
                __range1._4_4_ = (local_a8 - iVar5) * 0xf + __range1._4_4_;
              }
            }
            local_a8 = 1;
          }
          else {
            local_a8 = local_a8 + 1;
          }
        }
      }
      pSVar13 = Turn::getShiftType(this);
      psVar8 = ShiftType::getId_abi_cxx11_(pSVar13);
      std::__cxx11::string::operator=((string *)local_d0,(string *)psVar8);
      turnN = Turn::getDay(this);
      __range2._4_4_ = __range2._4_4_ + 1;
      pvVar10 = NurseSolution::getTurns(*(NurseSolution **)(contract._56_8_ + 0x20));
      sVar15 = std::vector<Turn_*,_std::allocator<Turn_*>_>::size(pvVar10);
      if (((long)__range2._4_4_ == sVar15) &&
         (iVar5 = Turn::getDay(this), uVar1 = lastShift.field_2._12_4_, iVar5 != 6)) {
        iVar5 = Contract::getMinimumNumberOfConsecutiveWorkingDays((Contract *)local_78);
        uVar2 = lastShift.field_2._12_4_;
        if ((int)uVar1 < iVar5) {
          iVar5 = Contract::getMinimumNumberOfConsecutiveWorkingDays((Contract *)local_78);
          __range1._4_4_ = (iVar5 - lastShift.field_2._12_4_) * 0x1e + __range1._4_4_;
        }
        else {
          iVar5 = Contract::getMaximumNumberOfConsecutiveWorkingDays((Contract *)local_78);
          uVar1 = lastShift.field_2._12_4_;
          if (iVar5 < (int)uVar2) {
            iVar5 = Contract::getMinimumNumberOfConsecutiveWorkingDays((Contract *)local_78);
            __range1._4_4_ = (uVar1 - iVar5) * 0x1e + __range1._4_4_;
          }
        }
        pSVar6 = Scenario::getInstance();
        pmVar12 = Scenario::getShifts_abi_cxx11_(pSVar6);
        pSVar13 = Turn::getShiftType(this);
        psVar8 = ShiftType::getId_abi_cxx11_(pSVar13);
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                  ::at(pmVar12,psVar8);
        iVar5 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar14);
        uVar1 = lastShift.field_2._12_4_;
        if (local_a8 < iVar5) {
          pSVar6 = Scenario::getInstance();
          pmVar12 = Scenario::getShifts_abi_cxx11_(pSVar6);
          pSVar13 = Turn::getShiftType(this);
          psVar8 = ShiftType::getId_abi_cxx11_(pSVar13);
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                    ::at(pmVar12,psVar8);
          iVar5 = ShiftType::getMinimumNumberOfConsecutiveAssignments(pmVar14);
          __range1._4_4_ = (iVar5 - local_a8) * 0xf + __range1._4_4_;
        }
        else {
          pSVar6 = Scenario::getInstance();
          pmVar12 = Scenario::getShifts_abi_cxx11_(pSVar6);
          pSVar13 = Turn::getShiftType(this);
          psVar8 = ShiftType::getId_abi_cxx11_(pSVar13);
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                    ::at(pmVar12,psVar8);
          iVar5 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar14);
          if (iVar5 < (int)uVar1) {
            pSVar6 = Scenario::getInstance();
            pmVar12 = Scenario::getShifts_abi_cxx11_(pSVar6);
            pSVar13 = Turn::getShiftType(this);
            psVar8 = ShiftType::getId_abi_cxx11_(pSVar13);
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                      ::at(pmVar12,psVar8);
            iVar5 = ShiftType::getMaximumNumberOfConsecutiveAssignments(pmVar14);
            __range1._4_4_ = (local_a8 - iVar5) * 0xf + __range1._4_4_;
          }
        }
      }
      __gnu_cxx::__normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
      operator++(&__end2);
    }
    std::__cxx11::string::~string((string *)local_d0);
    Contract::~Contract((Contract *)local_78);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
    ::operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

unsigned int Validator::constraintS2(const Solution &solution){

    unsigned int sum = 0;

    for(auto const &nurse : solution.getNurses())
        {
            Contract contract = Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract());

            int numberOfConsecutiveAssignments = nurse.second->getNurse()->getHistory().getNumberOfConsecutiveAssignments();

            int numberOfConsecutiveWorkingDays = nurse.second->getNurse()->getHistory().getNumberOfConsecutiveWorkingDays();

            string lastShift = nurse.second->getNurse()->getHistory().getLastAssignedShiftType();

            int day = -1;
            bool done = false;

            //iterate turns
            int turnN = 0;
            for(Turn * turn : nurse.second->getTurns())
            {
                if(lastShift == "None")
                    numberOfConsecutiveWorkingDays = 1;
                //if it stops being consecutive working days
                else if(turn->getDay() != day + 1) {
                    if (numberOfConsecutiveWorkingDays < contract.getMinimumNumberOfConsecutiveWorkingDays())
                        sum += 30 * (contract.getMinimumNumberOfConsecutiveWorkingDays() - numberOfConsecutiveWorkingDays);
                    else if (numberOfConsecutiveWorkingDays > contract.getMaximumNumberOfConsecutiveWorkingDays())
                        sum += 30 * (numberOfConsecutiveWorkingDays - contract.getMinimumNumberOfConsecutiveWorkingDays());


                    if (numberOfConsecutiveAssignments < Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments())
                        sum += 15 * (Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments() - numberOfConsecutiveAssignments);
                    else if (numberOfConsecutiveWorkingDays > Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments())
                        sum += 15 * (numberOfConsecutiveAssignments - Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments());

                    numberOfConsecutiveWorkingDays = 1;
                    numberOfConsecutiveAssignments = 1;
                    done = true;
                }
                else
                    numberOfConsecutiveWorkingDays++;
                if (!done) {
                    if(lastShift == "None"){
                        numberOfConsecutiveAssignments = 1;}
                    else if(lastShift != turn->getShiftType()->getId()) {

                        if (numberOfConsecutiveAssignments < Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments())
                            sum += 15 * (Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments() - numberOfConsecutiveAssignments);
                        else if (numberOfConsecutiveWorkingDays > Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments())
                            sum += 15 * (numberOfConsecutiveAssignments - Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments());

                        numberOfConsecutiveAssignments = 1;
                    }
                    else numberOfConsecutiveAssignments++;
                }

                lastShift = turn->getShiftType()->getId();
                day = turn->getDay();
                done = false;

                turnN++;
                if(turnN == nurse.second->getTurns().size())
                {
                    if(turn->getDay() != 6)
                    {
                        if (numberOfConsecutiveWorkingDays < contract.getMinimumNumberOfConsecutiveWorkingDays())
                            sum += 30 * (contract.getMinimumNumberOfConsecutiveWorkingDays() - numberOfConsecutiveWorkingDays);
                        else if (numberOfConsecutiveWorkingDays > contract.getMaximumNumberOfConsecutiveWorkingDays())
                            sum += 30 * (numberOfConsecutiveWorkingDays - contract.getMinimumNumberOfConsecutiveWorkingDays());


                        if (numberOfConsecutiveAssignments < Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments())
                            sum += 15 * (Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMinimumNumberOfConsecutiveAssignments() - numberOfConsecutiveAssignments);
                        else if (numberOfConsecutiveWorkingDays > Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments())
                            sum += 15 * (numberOfConsecutiveAssignments - Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId()).getMaximumNumberOfConsecutiveAssignments());
                    }

                }
            }
        }
    return sum;
}